

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O1

void __thiscall libcalc::Tokenizer::clear(Tokenizer *this)

{
  pointer ppTVar1;
  Token *pTVar2;
  pointer pcVar3;
  vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> *__range1;
  pointer ppTVar4;
  
  ppTVar1 = (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar4 = (this->tokens).
                 super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar4 != ppTVar1; ppTVar4 = ppTVar4 + 1) {
    pTVar2 = *ppTVar4;
    if (pTVar2 != (Token *)0x0) {
      pcVar3 = (pTVar2->value)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &(pTVar2->value).field_2) {
        operator_delete(pcVar3);
      }
      operator_delete(pTVar2);
    }
  }
  ppTVar4 = (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppTVar4) {
    (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar4;
  }
  return;
}

Assistant:

void Tokenizer::clear() {
  for (Token *t : tokens) {
    delete t;
  }

  tokens.clear();
}